

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<bool,short>(BaseAppender *this,Vector *col,bool input)

{
  short sVar1;
  
  sVar1 = Cast::Operation<bool,short>(input);
  *(short *)(col->data + (this->chunk).count * 2) = sVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}